

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3lamb_io.c
# Opt level: O0

int s3lamb_read(char *fn,float32 **out_lambda,uint32 *out_n_lambda)

{
  int iVar1;
  int32 iVar2;
  uint32 local_60;
  uint local_5c;
  uint32 swap;
  uint32 n_lambda;
  float32 *lambda;
  uint32 local_48;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 rd_chksum;
  char *do_chk;
  char *ver;
  FILE *fp;
  uint32 *out_n_lambda_local;
  float32 **out_lambda_local;
  char *fn_local;
  
  ignore = 0;
  fp = (FILE *)out_n_lambda;
  out_n_lambda_local = (uint32 *)out_lambda;
  out_lambda_local = (float32 **)fn;
  ver = (char *)s3open(fn,"rb",&local_60);
  if ((FILE *)ver == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    do_chk = s3get_gvn_fattr("version");
    if (do_chk == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
              ,0x4f,"No version attribute for %s\n",out_lambda_local);
      exit(1);
    }
    iVar1 = strcmp(do_chk,"1.0");
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
              ,0x4b,"Version mismatch for %s, file ver: %s != reader ver: %s\n",out_lambda_local,
              do_chk,"1.0");
      exit(1);
    }
    _sv_chksum = s3get_gvn_fattr("chksum0");
    iVar2 = bio_fread_1d((void **)&swap,4,&local_5c,(FILE *)ver,local_60,&ignore);
    if (iVar2 < 0) {
      fn_local._4_4_ = -1;
    }
    else {
      if (_sv_chksum != (char *)0x0) {
        iVar2 = bio_fread(&local_48,4,1,(FILE *)ver,local_60,(uint32 *)((long)&lambda + 4));
        if (iVar2 != 1) {
          s3close((FILE *)ver);
          return -1;
        }
        if (local_48 != ignore) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
                  ,0x68,"Checksum error; read corrupt data.\n");
          exit(1);
        }
      }
      s3close((FILE *)ver);
      *(void **)out_n_lambda_local = _swap;
      fp->_flags = local_5c;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
              ,0x71,"Read %s [%u array]\n",out_lambda_local,(ulong)local_5c);
      fn_local._4_4_ = 0;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3lamb_read(const char *fn,
	    float32 **out_lambda,
	    uint32 *out_n_lambda)
{
    FILE *fp;
    const char *ver;
    const char *do_chk;
    uint32 rd_chksum = 0, sv_chksum, ignore;
    float32 *lambda;
    uint32 n_lambda;
    uint32 swap;
    
    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version io */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, LAMBDA_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, LAMBDA_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (bio_fread_1d((void **)&lambda,
		  sizeof(float32),
		  &n_lambda,
		  fp,
		  swap,
		  &rd_chksum) < 0)
	return S3_ERROR;

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);

	    return S3_ERROR;
	}

	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }

    s3close(fp);

    *out_lambda = lambda;
    *out_n_lambda = n_lambda;

    E_INFO("Read %s [%u array]\n", fn, n_lambda);

    return S3_SUCCESS;
}